

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O3

void __thiscall
diy::Master::foreach<void(*)(PointBlock<3u>*,diy::Master::ProxyWithLink_const&)>
          (Master *this,_func_void_PointBlock<3U>_ptr_ProxyWithLink_ptr **f,Skip *s)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (_func_void_PointBlock<3U>_ptr_ProxyWithLink_ptr *)0x0;
  local_28._8_8_ = 0;
  if (*f != (_func_void_PointBlock<3U>_ptr_ProxyWithLink_ptr *)0x0) {
    pcStack_10 = Catch::clara::std::
                 _Function_handler<void_(PointBlock<3U>_*,_const_diy::Master::ProxyWithLink_&),_void_(*)(PointBlock<3U>_*,_const_diy::Master::ProxyWithLink_&)>
                 ::_M_invoke;
    local_18 = Catch::clara::std::
               _Function_handler<void_(PointBlock<3U>_*,_const_diy::Master::ProxyWithLink_&),_void_(*)(PointBlock<3U>_*,_const_diy::Master::ProxyWithLink_&)>
               ::_M_manager;
    local_28._M_unused._0_8_ = (undefined8)*f;
  }
  foreach_<PointBlock<3u>>(this,(Callback<PointBlock<3U>_> *)&local_28,s);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

mpi::communicator&        communicator()          { return comm_; }